

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  cmake *pcVar1;
  bool bVar2;
  byte bVar3;
  char *val;
  char *pcVar4;
  
  if (var->_M_string_length != 0) {
    val = GetDefinition(this,var);
    pcVar4 = val;
    if (val != (char *)0x0) {
      bVar2 = cmSystemTools::IsOn(val);
      pcVar4 = (char *)(ulong)bVar2;
    }
    bVar3 = (byte)pcVar4;
    if (val != (char *)0x0) goto LAB_003380e9;
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  bVar3 = 1;
  if (pcVar1->DebugOutput == false) {
    bVar3 = pcVar1->Trace;
  }
LAB_003380e9:
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var)
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if(!var.empty())
    {
    if(const char* val = this->GetDefinition(var))
      {
      return cmSystemTools::IsOn(val);
      }
    }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}